

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_func_op_cast_clustered
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type)

{
  bool forwarding;
  SPIRType *pSVar1;
  SPIRType *pSVar2;
  uint32_t uVar3;
  char *op_local;
  string local_200;
  string local_1e0;
  string expr;
  string cast_op0;
  SPIRType expected_type;
  
  op_local = op;
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  SPIRType::SPIRType(&expected_type,pSVar1);
  expected_type.super_IVariant._12_4_ = input_type;
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op0);
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc == input_type) {
    to_unpacked_expression_abi_cxx11_(&cast_op0,this,op0,true);
  }
  else {
    bitcast_glsl_abi_cxx11_(&cast_op0,this,&expected_type,op0);
  }
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  if (*(BaseType *)&(pSVar1->super_IVariant).field_0xc == input_type) {
    to_expression_abi_cxx11_(&local_1e0,this,op1,true);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_200,(spirv_cross *)&op_local,(char **)0x3965df,(char (*) [2])&cast_op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3964bc,
               (char (*) [3])&local_1e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,
               (char (*) [2])CONCAT44(result_type,result_id));
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::string::~string((string *)&local_1e0);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x38])(&local_200,this,pSVar1,&expected_type);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_200);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::string::push_back((char)&expr);
    uVar3 = result_id;
    to_expression_abi_cxx11_(&local_1e0,this,op1,true);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_200,(spirv_cross *)&op_local,(char **)0x3965df,(char (*) [2])&cast_op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3964bc,
               (char (*) [3])&local_1e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,
               (char (*) [2])CONCAT44(result_type,uVar3));
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::string::push_back((char)&expr);
  }
  forwarding = should_forward(this,op0);
  emit_op(this,result_type,result_id,&expr,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  ::std::__cxx11::string::~string((string *)&expr);
  ::std::__cxx11::string::~string((string *)&cast_op0);
  SPIRType::~SPIRType(&expected_type);
  return;
}

Assistant:

void CompilerGLSL::emit_binary_func_op_cast_clustered(uint32_t result_type, uint32_t result_id, uint32_t op0,
                                                      uint32_t op1, const char *op, SPIRType::BaseType input_type)
{
	// Special purpose method for implementing clustered subgroup opcodes.
	// Main difference is that op1 does not participate in any casting, it needs to be a literal.
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type;
	string cast_op0 =
	    expression_type(op0).basetype != input_type ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);

	string expr;
	if (out_type.basetype != input_type)
	{
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", to_expression(op1), ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", to_expression(op1), ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0));
	inherit_expression_dependencies(result_id, op0);
}